

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O3

void __thiscall
bssl::gtest_suite_PkitsTest16PrivateCertificateExtensions_::
Section16ValidUnknownNotCriticalCertificateExtensionTest1<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
::~Section16ValidUnknownNotCriticalCertificateExtensionTest1
          (Section16ValidUnknownNotCriticalCertificateExtensionTest1<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
           *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(
    PkitsTest16PrivateCertificateExtensions,
    Section16ValidUnknownNotCriticalCertificateExtensionTest1) {
  const char* const certs[] = {
      "TrustAnchorRootCertificate",
      "ValidUnknownNotCriticalCertificateExtensionTest1EE"};
  const char* const crls[] = {"TrustAnchorRootCRL"};
  PkitsTestInfo info;
  info.test_number = "4.16.1";
  info.should_validate = true;

  this->RunTest(certs, crls, info);
}